

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void legendre_associated_normalized(int n,int m,double x,double *cx)

{
  uint uVar1;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)m;
  if (m < 0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of M is ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,m);
    std::operator<<(poVar3,"\n");
    pcVar6 = "  but M must be nonnegative.\n";
  }
  else if (n < m) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of M = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,m);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of N = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
    std::operator<<(poVar3,"\n");
    pcVar6 = "  but M must be less than or equal to N.\n";
  }
  else if (x < -1.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,x);
    std::operator<<(poVar3,"\n");
    pcVar6 = "  but X must be no less than -1.\n";
  }
  else {
    if (x <= 1.0) {
      if (m == 0) {
        uVar8 = 0;
      }
      else {
        memset(cx,0,uVar2 * 8);
        uVar8 = uVar2;
      }
      cx[uVar8] = 1.0;
      dVar9 = 1.0 - x * x;
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar11 = 1.0;
      if (m != 0) {
        dVar10 = cx[uVar8];
        do {
          dVar10 = -dVar10 * dVar11 * dVar9;
          dVar11 = dVar11 + 2.0;
          uVar1 = (int)uVar2 - 1;
          uVar2 = (ulong)uVar1;
        } while (uVar1 != 0);
        cx[uVar8] = dVar10;
      }
      if (m < n) {
        cx[uVar8 + 1] = (double)(m * 2 + 1) * x * cx[uVar8];
      }
      uVar1 = m + 2;
      if ((int)uVar1 <= n) {
        dVar9 = cx[(ulong)uVar1 - 1];
        iVar5 = m * 2 + 3;
        uVar4 = ~(m * 2);
        lVar7 = 0;
        do {
          dVar9 = ((double)(int)uVar4 * cx[(ulong)uVar1 + lVar7 + -2] + (double)iVar5 * x * dVar9) /
                  (double)((int)lVar7 + 2);
          cx[(ulong)uVar1 + lVar7] = dVar9;
          iVar5 = iVar5 + 2;
          uVar4 = uVar4 - 1;
          lVar7 = lVar7 + 1;
        } while (m + 1 + (int)lVar7 < n);
      }
      iVar5 = m * 2 + 1;
      lVar7 = 0;
      do {
        dVar9 = r8_factorial((int)lVar7);
        dVar11 = r8_factorial((int)lVar7 + m * 2);
        dVar9 = (dVar9 * (double)iVar5) / (dVar11 * 12.566370614359172);
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        cx[uVar8 + lVar7] = dVar9 * cx[uVar8 + lVar7];
        iVar5 = iVar5 + 2;
        lVar7 = lVar7 + 1;
      } while (m + -1 + (int)lVar7 < n);
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Input value of X = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,x);
    std::operator<<(poVar3,"\n");
    pcVar6 = "  but X must be no more than 1.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar6);
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void legendre_associated_normalized ( int n, int m, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_ASSOCIATED_NORMALIZED: normalized associated Legendre functions.
//
//  Discussion:
//
//    The unnormalized associated Legendre functions P_N^M(X) have
//    the property that
//
//      Integral ( -1 <= X <= 1 ) ( P_N^M(X) )^2 dX
//      = 2 * ( N + M )! / ( ( 2 * N + 1 ) * ( N - M )! )
//
//    By dividing the function by the square root of this term,
//    the normalized associated Legendre functions have norm 1.
//
//    However, we plan to use these functions to build spherical
//    harmonics, so we use a slightly different normalization factor of
//
//      sqrt ( ( ( 2 * N + 1 ) * ( N - M )! ) / ( 4 * pi * ( N + M )! ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 March 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the maximum first index of the Legendre
//    function, which must be at least 0.
//
//    Input, int M, the second index of the Legendre function,
//    which must be at least 0, and no greater than N.
//
//    Input, double X, the point at which the function is to be
//    evaluated.  X must satisfy -1 <= X <= 1.
//
//    Output, double CX[N+1], the values of the first N+1 function.
//
{
  double factor;
  int i;
  int mm;
  const double r8_pi = 3.141592653589793;
  double somx2;

  if ( m < 0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of M is " << m << "\n";
    std::cerr << "  but M must be nonnegative.\n";
    exit ( 1 );
  }

  if ( n < m )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of M = " << m << "\n";
    std::cerr << "  Input value of N = " << n << "\n";
    std::cerr << "  but M must be less than or equal to N.\n";
    exit ( 1 );
  }

  if ( x < -1.0 )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no less than -1.\n";
    exit ( 1 );
  }

  if ( 1.0 < x )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_ASSOCIATED_NORMALIZED - Fatal error!\n";
    std::cerr << "  Input value of X = " << x << "\n";
    std::cerr << "  but X must be no more than 1.\n";
    exit ( 1 );
  }

  for ( i = 0; i <= m-1; i++ )
  {
    cx[i] = 0.0;
  }
  cx[m] = 1.0;

  somx2 = sqrt ( 1.0 - x * x );

  factor = 1.0;
  for ( i = 1; i <= m; i++ )
  {
    cx[m] = -cx[m] * factor * somx2;
    factor = factor + 2.0;
  }

  if ( m+1 <= n )
  {
    cx[m+1] = x * double( 2 * m + 1 ) * cx[m];
  }

  for ( i = m+2; i <= n; i++ )
  {
    cx[i] = ( double( 2 * i     - 1 ) * x * cx[i-1] 
            + double(   - i - m + 1 )     * cx[i-2] ) 
            / double(     i - m     );
  }
//
//  Normalization.
//
  for ( mm = m; mm <= n; mm++ )
  {
    factor = sqrt ( ( double( 2 * mm + 1 ) * r8_factorial ( mm - m ) ) 
      / ( 4.0 * r8_pi * r8_factorial ( mm + m ) ) );
    cx[mm] = cx[mm] * factor;
  }

  return;
}